

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O2

void highbd_prepare_horizontal_filter_coeff(int alpha,int sx,__m128i *coeff)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  int iVar17;
  
  iVar17 = sx >> 10;
  uVar1 = *(undefined4 *)(av1_warped_filter[iVar17] + 2);
  uVar2 = *(undefined4 *)(av1_warped_filter[iVar17] + 4);
  uVar3 = *(undefined4 *)(av1_warped_filter[iVar17] + 6);
  iVar16 = sx + alpha * 2 >> 10;
  uVar4 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar5 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar6 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar7 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  iVar16 = sx + alpha * 4 >> 10;
  uVar8 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar9 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar10 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar11 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  iVar16 = alpha * 6 + sx >> 10;
  uVar12 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar13 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar14 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar15 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  *(undefined4 *)*coeff = *(undefined4 *)av1_warped_filter[iVar17];
  *(undefined4 *)((long)*coeff + 4) = uVar4;
  *(undefined4 *)(*coeff + 1) = uVar8;
  *(undefined4 *)((long)*coeff + 0xc) = uVar12;
  *(undefined4 *)coeff[2] = uVar1;
  *(undefined4 *)((long)coeff[2] + 4) = uVar5;
  *(undefined4 *)(coeff[2] + 1) = uVar9;
  *(undefined4 *)((long)coeff[2] + 0xc) = uVar13;
  *(undefined4 *)coeff[4] = uVar2;
  *(undefined4 *)((long)coeff[4] + 4) = uVar6;
  *(undefined4 *)(coeff[4] + 1) = uVar10;
  *(undefined4 *)((long)coeff[4] + 0xc) = uVar14;
  *(undefined4 *)coeff[6] = uVar3;
  *(undefined4 *)((long)coeff[6] + 4) = uVar7;
  *(undefined4 *)(coeff[6] + 1) = uVar11;
  *(undefined4 *)((long)coeff[6] + 0xc) = uVar15;
  iVar17 = sx + alpha >> 10;
  uVar1 = *(undefined4 *)(av1_warped_filter[iVar17] + 2);
  uVar2 = *(undefined4 *)(av1_warped_filter[iVar17] + 4);
  uVar3 = *(undefined4 *)(av1_warped_filter[iVar17] + 6);
  iVar16 = alpha * 3 + sx >> 10;
  uVar4 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar5 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar6 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar7 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  iVar16 = alpha * 5 + sx >> 10;
  uVar8 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar9 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar10 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar11 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  iVar16 = alpha * 7 + sx >> 10;
  uVar12 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar13 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar14 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar15 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  *(undefined4 *)coeff[1] = *(undefined4 *)av1_warped_filter[iVar17];
  *(undefined4 *)((long)coeff[1] + 4) = uVar4;
  *(undefined4 *)(coeff[1] + 1) = uVar8;
  *(undefined4 *)((long)coeff[1] + 0xc) = uVar12;
  *(undefined4 *)coeff[3] = uVar1;
  *(undefined4 *)((long)coeff[3] + 4) = uVar5;
  *(undefined4 *)(coeff[3] + 1) = uVar9;
  *(undefined4 *)((long)coeff[3] + 0xc) = uVar13;
  *(undefined4 *)coeff[5] = uVar2;
  *(undefined4 *)((long)coeff[5] + 4) = uVar6;
  *(undefined4 *)(coeff[5] + 1) = uVar10;
  *(undefined4 *)((long)coeff[5] + 0xc) = uVar14;
  *(undefined4 *)coeff[7] = uVar3;
  *(undefined4 *)((long)coeff[7] + 4) = uVar7;
  *(undefined4 *)(coeff[7] + 1) = uVar11;
  *(undefined4 *)((long)coeff[7] + 0xc) = uVar15;
  return;
}

Assistant:

static inline void highbd_prepare_horizontal_filter_coeff(int alpha, int sx,
                                                          __m128i *coeff) {
  // Filter even-index pixels
  const __m128i tmp_0 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 0 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_2 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 2 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_4 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 4 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_6 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 6 * alpha) >> WARPEDDIFF_PREC_BITS)));

  // coeffs 0 1 0 1 2 3 2 3 for pixels 0, 2
  const __m128i tmp_8 = _mm_unpacklo_epi32(tmp_0, tmp_2);
  // coeffs 0 1 0 1 2 3 2 3 for pixels 4, 6
  const __m128i tmp_10 = _mm_unpacklo_epi32(tmp_4, tmp_6);
  // coeffs 4 5 4 5 6 7 6 7 for pixels 0, 2
  const __m128i tmp_12 = _mm_unpackhi_epi32(tmp_0, tmp_2);
  // coeffs 4 5 4 5 6 7 6 7 for pixels 4, 6
  const __m128i tmp_14 = _mm_unpackhi_epi32(tmp_4, tmp_6);

  // coeffs 0 1 0 1 0 1 0 1 for pixels 0, 2, 4, 6
  coeff[0] = _mm_unpacklo_epi64(tmp_8, tmp_10);
  // coeffs 2 3 2 3 2 3 2 3 for pixels 0, 2, 4, 6
  coeff[2] = _mm_unpackhi_epi64(tmp_8, tmp_10);
  // coeffs 4 5 4 5 4 5 4 5 for pixels 0, 2, 4, 6
  coeff[4] = _mm_unpacklo_epi64(tmp_12, tmp_14);
  // coeffs 6 7 6 7 6 7 6 7 for pixels 0, 2, 4, 6
  coeff[6] = _mm_unpackhi_epi64(tmp_12, tmp_14);

  // Filter odd-index pixels
  const __m128i tmp_1 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 1 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_3 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 3 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_5 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 5 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_7 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 7 * alpha) >> WARPEDDIFF_PREC_BITS)));

  const __m128i tmp_9 = _mm_unpacklo_epi32(tmp_1, tmp_3);
  const __m128i tmp_11 = _mm_unpacklo_epi32(tmp_5, tmp_7);
  const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_1, tmp_3);
  const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_5, tmp_7);

  coeff[1] = _mm_unpacklo_epi64(tmp_9, tmp_11);
  coeff[3] = _mm_unpackhi_epi64(tmp_9, tmp_11);
  coeff[5] = _mm_unpacklo_epi64(tmp_13, tmp_15);
  coeff[7] = _mm_unpackhi_epi64(tmp_13, tmp_15);
}